

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_cstring.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
boost::unit_test::operator+
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          basic_cstring<const_char> *rhs)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (lhs->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + lhs->_M_string_length);
  std::__cxx11::string::replace
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
             (ulong)rhs->m_begin);
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<CharT1>
operator+( std::basic_string<CharT1> const& lhs, basic_cstring<CharT2> const& rhs )
{
    std::basic_string<CharT1> res( lhs );

    res.append( rhs.begin(), rhs.end() );
    return res;
}